

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_main_oj.cpp
# Opt level: O0

int __thiscall
Solution::maximumMinutes
          (Solution *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *g)

{
  bool bVar1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_40;
  int local_28;
  int local_24;
  int ans;
  int mid;
  int r;
  int l;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *g_local;
  Solution *this_local;
  
  mid = -1;
  ans = 1000000000;
  _r = g;
  g_local = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)this;
  while (mid <= ans) {
    local_24 = mid + ans >> 1;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector(&local_40,_r);
    bVar1 = ok(this,&local_40,local_24);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_40);
    if (bVar1) {
      local_28 = local_24;
      mid = local_24 + 1;
    }
    else {
      ans = local_24 + -1;
    }
  }
  return local_28;
}

Assistant:

int maximumMinutes(vector<vector<int>>& g) {
        int l = -1, r = 1e9, mid, ans;
        while(l <= r)
        {
            mid = (l+r)>>1;
            if(ok(g, mid))
            {
                ans = mid;
                l = mid+1;
            }
            else
                r = mid-1;
        }
        return ans;
    }